

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionBody::RecordNativeThrowMap
          (FunctionBody *this,SmallSpanSequenceIter *iter,uint32 nativeOffset,uint32 statementIndex,
          EntryPointInfo *entryPoint,uint loopNum)

{
  SmallSpanSequence *this_00;
  HeapAllocator *alloc;
  int local_70;
  int iStack_6c;
  StatementData data;
  
  this_00 = EntryPointInfo::GetNativeThrowSpanSequence(entryPoint);
  if (this_00 == (SmallSpanSequence *)0x0) {
    if (statementIndex == 0xffffffff) {
      return;
    }
    _local_70 = &SmallSpanSequence::typeinfo;
    data.sourceBegin = 0;
    data.bytecodeBegin = 0;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)&stack0xffffffffffffff90);
    this_00 = (SmallSpanSequence *)new<Memory::HeapAllocator>(0x18,alloc,0x300d4a);
    SmallSpanSequence::SmallSpanSequence(this_00);
    if (loopNum == 0xffffffff) {
      EntryPointInfo::SetNativeThrowSpanSequence(entryPoint,this_00);
    }
    else {
      SetNativeThrowSpanSequence(this,this_00,loopNum,(LoopEntryPointInfo *)entryPoint);
    }
  }
  else if (iter->accumulatedSourceBegin == statementIndex) {
    return;
  }
  iStack_6c = nativeOffset;
  local_70 = statementIndex;
  SmallSpanSequence::RecordARange(this_00,iter,(StatementData *)&stack0xffffffffffffff90);
  return;
}

Assistant:

void
    FunctionBody::RecordNativeThrowMap(SmallSpanSequenceIter& iter, uint32 nativeOffset, uint32 statementIndex, EntryPointInfo* entryPoint, uint loopNum)
    {
        SmallSpanSequence *pSpanSequence;

        pSpanSequence = entryPoint->GetNativeThrowSpanSequence();

        if (!pSpanSequence)
        {
            if (statementIndex == -1)
            {
                return; // No need to initialize native throw map for non-user code
            }

            pSpanSequence = HeapNew(SmallSpanSequence);
            if (loopNum == LoopHeader::NoLoop)
            {
                ((FunctionEntryPointInfo*) entryPoint)->SetNativeThrowSpanSequence(pSpanSequence);
            }
            else
            {
                this->SetNativeThrowSpanSequence(pSpanSequence, loopNum, (LoopEntryPointInfo*) entryPoint);
            }
        }
        else if (iter.accumulatedSourceBegin == static_cast<int>(statementIndex))
        {
            return; // Compress adjacent spans which share the same statementIndex
        }

        StatementData data;
        data.sourceBegin = static_cast<int>(statementIndex); // sourceBegin represents statementIndex here
        data.bytecodeBegin = static_cast<int>(nativeOffset); // bytecodeBegin represents nativeOffset here

        pSpanSequence->RecordARange(iter, &data);
    }